

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# globals.c
# Opt level: O1

xmlRegisterNodeFunc xmlThrDefRegisterNodeDefault(xmlRegisterNodeFunc func)

{
  xmlRegisterNodeFunc p_Var1;
  
  xmlMutexLock(&xmlThrDefMutex);
  p_Var1 = xmlRegisterNodeDefaultValueThrDef;
  xmlRegisterCallbacks = 1;
  xmlRegisterNodeDefaultValueThrDef = func;
  xmlMutexUnlock(&xmlThrDefMutex);
  return p_Var1;
}

Assistant:

xmlRegisterNodeFunc
xmlThrDefRegisterNodeDefault(xmlRegisterNodeFunc func)
{
    xmlRegisterNodeFunc old;

    xmlMutexLock(&xmlThrDefMutex);
    old = xmlRegisterNodeDefaultValueThrDef;

    xmlRegisterCallbacks = 1;
    xmlRegisterNodeDefaultValueThrDef = func;
    xmlMutexUnlock(&xmlThrDefMutex);

    return(old);
}